

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::ProcessCommandLineArguments
          (cmCTestBuildAndTestHandler *this,string *currentArg,size_t *idx,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs)

{
  string *in_relative;
  pointer pbVar1;
  cmCTest *this_00;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  string *in_relative_00;
  double dVar8;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52d931);
  if (lVar3 == 0) {
    uVar5 = *idx;
    uVar7 = (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar5 < uVar7 - 1) {
      if (uVar7 <= uVar5 + 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "--build-and-test must have source and binary dir");
        std::endl<char,std::char_traits<char>>(poVar6);
        this_00 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,0x1cf,local_1c8[0],false);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        return 0;
      }
      *idx = uVar5 + 1;
      in_relative = &this->SourceDir;
      std::__cxx11::string::_M_assign((string *)in_relative);
      *idx = *idx + 1;
      in_relative_00 = &this->BinaryDir;
      std::__cxx11::string::_M_assign((string *)in_relative_00);
      cmsys::SystemTools::MakeDirectory((this->BinaryDir)._M_dataplus._M_p);
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,in_relative_00);
      std::__cxx11::string::operator=((string *)in_relative_00,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,in_relative);
      std::__cxx11::string::operator=((string *)in_relative,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52d963);
  if (lVar3 == 0) {
    pbVar1 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar4 = *idx + 1;
      *idx = sVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->BuildTargets,pbVar1 + sVar4);
    }
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52d996);
  if (lVar3 == 0) {
    this->BuildNoCMake = true;
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52d9d1);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildRunDir);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52da09);
  if (lVar3 == 0) {
    this->BuildTwoConfig = true;
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52da2c);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ExecutableDirectory);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52dc7b);
  if (lVar3 == 0) {
    pbVar1 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar4 = *idx + 1;
      *idx = sVar4;
      dVar8 = atof(pbVar1[sVar4]._M_dataplus._M_p);
      this->Timeout = dVar8;
    }
  }
  bVar2 = std::operator==(currentArg,"--build-generator");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGenerator);
  }
  bVar2 = std::operator==(currentArg,"--build-generator-platform");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorPlatform);
  }
  bVar2 = std::operator==(currentArg,"--build-generator-toolset");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorToolset);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52db1c);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildProject);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52db56);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildMakeProgram);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52dbb5);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ConfigSample);
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52db8b);
  if (lVar3 == 0) {
    this->BuildNoClean = true;
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52dc05);
  if (lVar3 == 0) {
    while( true ) {
      pbVar1 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((ulong)((long)(allArgs->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
            *idx + 1) || (bVar2 = std::operator!=(pbVar1 + *idx + 1,"--build-target"), !bVar2)) ||
         (bVar2 = std::operator!=((allArgs->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + *idx + 1,
                                  "--test-command"), !bVar2)) break;
      sVar4 = *idx;
      *idx = sVar4 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->BuildOptions,
                  (allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + sVar4 + 1);
    }
  }
  lVar3 = std::__cxx11::string::find((char *)currentArg,0x52dc3a);
  if ((lVar3 == 0) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->TestCommand);
    while( true ) {
      uVar5 = *idx + 1;
      pbVar1 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(allArgs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5)
      break;
      *idx = uVar5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->TestCommandArgs,pbVar1 + uVar5);
    }
  }
  return 1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessCommandLineArguments(
  const std::string& currentArg, size_t& idx,
  const std::vector<std::string>& allArgs)
{
  // --build-and-test options
  if(currentArg.find("--build-and-test",0) == 0 && idx < allArgs.size() - 1)
    {
    if(idx+2 < allArgs.size())
      {
      idx++;
      this->SourceDir = allArgs[idx];
      idx++;
      this->BinaryDir = allArgs[idx];
      // dir must exist before CollapseFullPath is called
      cmSystemTools::MakeDirectory(this->BinaryDir.c_str());
      this->BinaryDir
        = cmSystemTools::CollapseFullPath(this->BinaryDir);
      this->SourceDir
        = cmSystemTools::CollapseFullPath(this->SourceDir);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "--build-and-test must have source and binary dir" << std::endl);
      return 0;
      }
    }
  if(currentArg.find("--build-target",0) == 0 && idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildTargets.push_back(allArgs[idx]);
    }
  if(currentArg.find("--build-nocmake",0) == 0)
    {
    this->BuildNoCMake = true;
    }
  if(currentArg.find("--build-run-dir",0) == 0 && idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildRunDir = allArgs[idx];
    }
  if(currentArg.find("--build-two-config",0) == 0)
    {
    this->BuildTwoConfig = true;
    }
  if(currentArg.find("--build-exe-dir",0) == 0 && idx < allArgs.size() - 1)
    {
    idx++;
    this->ExecutableDirectory = allArgs[idx];
    }
  if(currentArg.find("--test-timeout",0) == 0 && idx < allArgs.size() - 1)
    {
    idx++;
    this->Timeout = atof(allArgs[idx].c_str());
    }
  if(currentArg == "--build-generator" && idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildGenerator = allArgs[idx];
    }
  if(currentArg == "--build-generator-platform" &&
     idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildGeneratorPlatform = allArgs[idx];
    }
  if(currentArg == "--build-generator-toolset" &&
     idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildGeneratorToolset = allArgs[idx];
    }
  if(currentArg.find("--build-project",0) == 0 && idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildProject = allArgs[idx];
    }
  if(currentArg.find("--build-makeprogram",0) == 0 &&
    idx < allArgs.size() - 1)
    {
    idx++;
    this->BuildMakeProgram = allArgs[idx];
    }
  if(currentArg.find("--build-config-sample",0) == 0 &&
    idx < allArgs.size() - 1)
    {
    idx++;
    this->ConfigSample = allArgs[idx];
    }
  if(currentArg.find("--build-noclean",0) == 0)
    {
    this->BuildNoClean = true;
    }
  if(currentArg.find("--build-options",0) == 0)
    {
    while(idx+1 < allArgs.size() &&
          allArgs[idx+1] != "--build-target" &&
          allArgs[idx+1] != "--test-command")
      {
      ++idx;
      this->BuildOptions.push_back(allArgs[idx]);
      }
    }
  if(currentArg.find("--test-command",0) == 0 && idx < allArgs.size() - 1)
    {
    ++idx;
    this->TestCommand = allArgs[idx];
    while(idx+1 < allArgs.size())
      {
      ++idx;
      this->TestCommandArgs.push_back(allArgs[idx]);
      }
    }
  return 1;
}